

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,AssetPath *asset)

{
  ulong uVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  string in_s;
  string s;
  string quote_str;
  
  std::__cxx11::string::string((string *)&in_s,(string *)asset);
  if (in_s._M_string_length == 0) {
    std::operator<<(ofs,"@@");
  }
  else {
    std::__cxx11::string::string((string *)&quote_str,"@",(allocator *)&s);
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    bVar2 = tinyusdz::contains(&in_s,'@');
    if (bVar2) {
      for (uVar4 = 0; uVar4 < in_s._M_string_length; uVar4 = uVar4 + 1) {
        uVar1 = uVar4 + 2;
        if (uVar1 < in_s._M_string_length) {
          if (((in_s._M_dataplus._M_p[uVar4] == '@') && (in_s._M_dataplus._M_p[uVar4 + 1] == '@'))
             && (in_s._M_dataplus._M_p[uVar1] == '@')) {
            std::__cxx11::string::append((char *)&s);
            uVar4 = uVar1;
          }
          else {
            std::__cxx11::string::push_back((char)&s);
          }
        }
      }
      std::__cxx11::string::assign((char *)&quote_str);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&s);
    }
    poVar3 = std::operator<<(ofs,(string *)&quote_str);
    poVar3 = std::operator<<(poVar3,(string *)&s);
    std::operator<<(poVar3,(string *)&quote_str);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs,
                         const tinyusdz::value::AssetPath &asset) {
  std::string in_s = asset.GetAssetPath();

  if (in_s.empty()) {
    ofs << "@@";
  } else {
    std::string quote_str = "@";

    std::string s;

    if (tinyusdz::contains(in_s, '@')) {
      // Escape '@@@'(to '\@@@') if the input path contains '@@@'
      for (size_t i = 0; i < in_s.length(); i++) {
        if ((i + 2) < in_s.length()) {
          if (in_s[i] == '@' && in_s[i + 1] == '@' && in_s[i + 2] == '@') {
            s += "\\@@@";
            i += 2;
          } else {
            s += in_s[i];
          }
        }
      }

      quote_str = "@@@";
    } else {
      s = in_s;
    }

    // Do not escape backslash for asset path
    ofs << quote_str << s << quote_str;
  }

  return ofs;
}